

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmValue __thiscall
cmGeneratorTarget::GetFileSuffixInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *language)

{
  cmMakefile *this_00;
  undefined8 __s;
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  allocator<char> local_151;
  string local_150;
  string *local_130;
  string *local_128;
  cmAlphaNum local_120;
  cmAlphaNum local_f0;
  undefined1 local_c0 [8];
  string langSuffix;
  char *suffixVar;
  string local_90;
  byte local_6d;
  byte local_5a;
  allocator<char> local_59;
  string local_58;
  byte local_31;
  string *psStack_30;
  bool isImportedLibraryArtifact;
  string *language_local;
  string *psStack_20;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  cmValue targetSuffix;
  
  psStack_30 = language;
  language_local._4_4_ = artifact;
  psStack_20 = config;
  config_local = (string *)this;
  TVar2 = GetType(this);
  if ((((TVar2 == STATIC_LIBRARY) || (TVar2 = GetType(this), TVar2 == SHARED_LIBRARY)) ||
      (TVar2 = GetType(this), TVar2 == MODULE_LIBRARY)) ||
     (TVar2 = GetType(this), TVar2 == EXECUTABLE)) {
    local_31 = language_local._4_4_ == ImportLibraryArtifact;
    if ((!(bool)local_31) || (bVar1 = NeedImportLibraryName(this,psStack_20), bVar1)) {
      TVar2 = GetType(this);
      if (((TVar2 != SHARED_LIBRARY) && (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) &&
         (TVar2 = GetType(this), TVar2 != EXECUTABLE)) {
        language_local._4_4_ = RuntimeBinaryArtifact;
      }
      local_5a = 0;
      local_6d = 0;
      suffixVar._6_1_ = 0;
      suffixVar._5_1_ = 0;
      if ((local_31 & 1) == 0) {
        std::allocator<char>::allocator();
        suffixVar._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"SUFFIX",(allocator<char> *)((long)&suffixVar + 7));
        suffixVar._5_1_ = 1;
        this_local = (cmGeneratorTarget *)GetProperty(this,&local_90);
      }
      else {
        std::allocator<char>::allocator();
        local_5a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"IMPORT_SUFFIX",&local_59);
        local_6d = 1;
        this_local = (cmGeneratorTarget *)GetProperty(this,&local_58);
      }
      if ((suffixVar._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_90);
      }
      if ((suffixVar._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&suffixVar + 7));
      }
      if ((local_6d & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_58);
      }
      if ((local_5a & 1) != 0) {
        std::allocator<char>::~allocator(&local_59);
      }
      bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
      if (!bVar1) {
        langSuffix.field_2._8_8_ =
             cmTarget::GetSuffixVariableInternal(this->Target,language_local._4_4_);
        uVar3 = std::__cxx11::string::empty();
        if (((uVar3 & 1) == 0) && (bVar1 = cmNonempty((char *)langSuffix.field_2._8_8_), bVar1)) {
          cmAlphaNum::cmAlphaNum(&local_f0,(char *)langSuffix.field_2._8_8_);
          cmAlphaNum::cmAlphaNum(&local_120,"_");
          cmStrCat<std::__cxx11::string>((string *)local_c0,&local_f0,&local_120,psStack_30);
          local_128 = (string *)cmMakefile::GetDefinition(this->Makefile,(string *)local_c0);
          this_local = (cmGeneratorTarget *)local_128;
          std::__cxx11::string::~string((string *)local_c0);
        }
        bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
        __s = langSuffix.field_2._8_8_;
        if ((!bVar1) && (langSuffix.field_2._8_8_ != 0)) {
          this_00 = this->Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,(char *)__s,&local_151);
          local_130 = (string *)cmMakefile::GetDefinition(this_00,&local_150);
          this_local = (cmGeneratorTarget *)local_130;
          std::__cxx11::string::~string((string *)&local_150);
          std::allocator<char>::~allocator(&local_151);
        }
      }
    }
    else {
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
    }
  }
  else {
    cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
  }
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmGeneratorTarget::GetFileSuffixInternal(
  std::string const& config, cmStateEnums::ArtifactType artifact,
  const std::string& language) const
{
  // no suffix for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return nullptr;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty suffix for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact && !this->NeedImportLibraryName(config)) {
    return nullptr;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute suffix value.
  cmValue targetSuffix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_SUFFIX")
                               : this->GetProperty("SUFFIX"));

  if (!targetSuffix) {
    const char* suffixVar = this->Target->GetSuffixVariableInternal(artifact);
    if (!language.empty() && cmNonempty(suffixVar)) {
      std::string langSuffix = cmStrCat(suffixVar, "_", language);
      targetSuffix = this->Makefile->GetDefinition(langSuffix);
    }

    // if there is no suffix on the target nor specific language
    // use the cmake definition.
    if (!targetSuffix && suffixVar) {
      targetSuffix = this->Makefile->GetDefinition(suffixVar);
    }
  }

  return targetSuffix;
}